

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

void __thiscall testing::internal::DeathTestImpl::ReadAndInterpretStatusByte(DeathTestImpl *this)

{
  int iVar1;
  int *piVar2;
  ostream *poVar3;
  bool bVar4;
  int local_164;
  string local_160;
  allocator<char> local_139;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  int local_54;
  string local_50 [4];
  int gtest_retval;
  GTestLog local_30 [5];
  GTestLog local_1c;
  int local_18;
  char local_11;
  int bytes_read;
  char flag;
  DeathTestImpl *this_local;
  
  _bytes_read = this;
  do {
    iVar1 = read_fd(this);
    local_18 = posix::Read(iVar1,&local_11,1);
    bVar4 = false;
    if (local_18 == -1) {
      piVar2 = __errno_location();
      bVar4 = *piVar2 == 4;
    }
  } while (bVar4);
  if (local_18 == 0) {
    set_outcome(this,DIED);
  }
  else if (local_18 == 1) {
    switch(local_11) {
    case 'I':
      iVar1 = read_fd(this);
      FailFromInternalError(iVar1);
      break;
    default:
      GTestLog::GTestLog(&local_1c,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/Ed-Yang[P]gturtle/build_O0/googletest-src/googletest/src/gtest-death-test.cc"
                         ,499);
      poVar3 = GTestLog::GetStream(&local_1c);
      poVar3 = std::operator<<(poVar3,"Death test child process reported ");
      poVar3 = std::operator<<(poVar3,"unexpected status byte (");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)local_11);
      std::operator<<(poVar3,")");
      GTestLog::~GTestLog(&local_1c);
      break;
    case 'L':
      set_outcome(this,LIVED);
      break;
    case 'R':
      set_outcome(this,RETURNED);
      break;
    case 'T':
      set_outcome(this,THREW);
    }
  }
  else {
    GTestLog::GTestLog(local_30,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Ed-Yang[P]gturtle/build_O0/googletest-src/googletest/src/gtest-death-test.cc"
                       ,0x1f8);
    poVar3 = GTestLog::GetStream(local_30);
    poVar3 = std::operator<<(poVar3,"Read from death test child process failed: ");
    GetLastErrnoDescription_abi_cxx11_();
    std::operator<<(poVar3,local_50);
    std::__cxx11::string::~string(local_50);
    GTestLog::~GTestLog(local_30);
  }
  while( true ) {
    do {
      iVar1 = read_fd(this);
      local_54 = posix::Close(iVar1);
      bVar4 = false;
      if (local_54 == -1) {
        piVar2 = __errno_location();
        bVar4 = *piVar2 == 4;
      }
    } while (bVar4);
    if (local_54 == -1) break;
    bVar4 = AlwaysFalse();
    if (!bVar4) {
      set_read_fd(this,-1);
      return;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"CHECK failed: File ",&local_139);
  std::operator+(&local_118,&local_138,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/Ed-Yang[P]gturtle/build_O0/googletest-src/googletest/src/gtest-death-test.cc"
                );
  std::operator+(&local_f8,&local_118,", line ");
  local_164 = 0x1fb;
  StreamableToString<int>(&local_160,&local_164);
  std::operator+(&local_d8,&local_f8,&local_160);
  std::operator+(&local_b8,&local_d8,": ");
  std::operator+(&local_98,&local_b8,"posix::Close(read_fd())");
  std::operator+(&local_78,&local_98," != -1");
  DeathTestAbort(&local_78);
}

Assistant:

void DeathTestImpl::ReadAndInterpretStatusByte() {
  char flag;
  int bytes_read;

  // The read() here blocks until data is available (signifying the
  // failure of the death test) or until the pipe is closed (signifying
  // its success), so it's okay to call this in the parent before
  // the child process has exited.
  do {
    bytes_read = posix::Read(read_fd(), &flag, 1);
  } while (bytes_read == -1 && errno == EINTR);

  if (bytes_read == 0) {
    set_outcome(DIED);
  } else if (bytes_read == 1) {
    switch (flag) {
      case kDeathTestReturned:
        set_outcome(RETURNED);
        break;
      case kDeathTestThrew:
        set_outcome(THREW);
        break;
      case kDeathTestLived:
        set_outcome(LIVED);
        break;
      case kDeathTestInternalError:
        FailFromInternalError(read_fd());  // Does not return.
        break;
      default:
        GTEST_LOG_(FATAL) << "Death test child process reported "
                          << "unexpected status byte ("
                          << static_cast<unsigned int>(flag) << ")";
    }
  } else {
    GTEST_LOG_(FATAL) << "Read from death test child process failed: "
                      << GetLastErrnoDescription();
  }
  GTEST_DEATH_TEST_CHECK_SYSCALL_(posix::Close(read_fd()));
  set_read_fd(-1);
}